

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_opt.c
# Opt level: O0

void av1_block_yrd_idtx(MACROBLOCK *x,uint8_t *pred_buf,int pred_stride,RD_STATS *this_rdc,
                       int *skippable,BLOCK_SIZE bsize,TX_SIZE tx_size)

{
  int src_stride;
  int iVar1;
  int64_t iVar2;
  int *in_RCX;
  int in_EDX;
  uint8_t *in_RSI;
  long *in_RDI;
  uint *in_R8;
  byte in_R9B;
  byte in_stack_00000008;
  int16_t *src_diff;
  int s;
  int c;
  int r;
  int diff_stride;
  int16_t *low_dqcoeff;
  int16_t *low_qcoeff;
  int16_t *low_coeff;
  uint16_t eob [1];
  tran_low_t coeff_buf [256];
  tran_low_t qcoeff_buf [256];
  tran_low_t dqcoeff_buf [256];
  SCAN_ORDER *scan_order;
  int tx_wd;
  int temp_skippable;
  int num_blk_skip_w;
  int bh;
  int bw;
  int eob_cost;
  int max_blocks_high;
  int max_blocks_wide;
  int block_step;
  int step;
  int num_4x4_h;
  int num_4x4_w;
  macroblock_plane *p;
  MACROBLOCKD *xd;
  int is_txfm_skip;
  int local_d88;
  int local_d80;
  int local_d6c;
  int local_d68;
  ushort local_d42;
  int16_t local_d40 [512];
  int16_t local_940 [512];
  int16_t local_540 [528];
  SCAN_ORDER *local_120;
  int local_118;
  uint local_114;
  uint local_110;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  uint local_f0;
  uint local_ec;
  long *local_e8;
  long *local_e0;
  uint *local_d0;
  int *local_c8;
  long *local_b0;
  uint local_a8;
  int local_a4;
  int *local_a0;
  int *local_98;
  int16_t *local_90;
  int16_t *local_88;
  int16_t *local_80;
  uint local_78;
  int local_74;
  uint *local_70;
  long *local_68;
  
  local_e0 = in_RDI + 0x34;
  local_110 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [in_R9B];
  local_f0 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [in_R9B];
  local_f4 = 1 << ((in_stack_00000008 & 0xf) << 1);
  local_f8 = 1 << (in_stack_00000008 & 0x1f);
  if ((int)in_RDI[0x413] < 0) {
    local_d80 = (int)in_RDI[0x413] >> 5;
  }
  else {
    local_d80 = 0;
  }
  local_fc = local_110 + local_d80;
  if ((int)in_RDI[0x414] < 0) {
    local_d88 = (int)in_RDI[0x414] >> 5;
  }
  else {
    local_d88 = 0;
  }
  local_100 = local_f0 + local_d88;
  local_104 = 0;
  local_108 = local_110 << 2;
  local_10c = local_f0 << 2;
  local_114 = 1;
  local_118 = 0;
  local_120 = (SCAN_ORDER *)0x0;
  switch(in_stack_00000008) {
  case 1:
    local_120 = &av1_fast_idtx_scan_order_8x8;
    local_118 = 8;
    break;
  case 2:
    local_120 = &av1_fast_idtx_scan_order_16x16;
    local_118 = 0x10;
    break;
  case 3:
    break;
  case 4:
    break;
  default:
    local_120 = &av1_fast_idtx_scan_order_4x4;
    local_118 = 4;
  }
  in_RCX[2] = 0;
  in_RCX[3] = 0;
  *in_RCX = 0;
  local_ec = local_110;
  local_e8 = in_RDI;
  local_d0 = in_R8;
  local_c8 = in_RCX;
  local_b0 = in_RDI;
  (*aom_subtract_block)
            (local_10c,local_108,(int16_t *)*in_RDI,(long)local_108,(uint8_t *)in_RDI[6],
             (long)(int)in_RDI[9],in_RSI,(long)in_EDX);
  src_stride = local_108;
  for (local_d68 = 0; local_d68 < local_100; local_d68 = local_f8 + local_d68) {
    for (local_d6c = 0; local_d6c < local_fc; local_d6c = local_f8 + local_d6c) {
      scale_square_buf_vals
                (local_d40,local_118,
                 (int16_t *)(*local_e8 + (long)((local_d68 * src_stride + local_d6c) * 4) * 2),
                 src_stride);
      (*av1_quantize_lp)(local_d40,(long)(local_118 * local_118),(int16_t *)local_e8[0xb],
                         (int16_t *)local_e8[10],local_940,local_540,(int16_t *)local_e8[0x10],
                         &local_d42,local_120->scan,local_120->iscan);
      local_a4 = local_d68 * local_110 + local_d6c;
      local_68 = local_b0;
      local_70 = &local_114;
      local_74 = local_f4;
      local_78 = (uint)local_d42;
      local_98 = local_c8;
      local_a0 = &local_104;
      local_a8 = (uint)(local_78 == 0);
      local_114 = local_a8 & local_114;
      *(bool *)((long)local_b0 + (long)local_a4 + 0x24e09) = local_78 == 0;
      local_90 = local_540;
      local_88 = local_940;
      local_80 = local_d40;
      iVar1 = get_msb(local_78 + 1);
      *local_a0 = iVar1 + *local_a0;
      if (local_78 == 1) {
        iVar1 = (int)*local_88;
        if (iVar1 < 1) {
          iVar1 = -iVar1;
        }
        *local_98 = iVar1 + *local_98;
      }
      else if (1 < (int)local_78) {
        iVar1 = (*aom_satd_lp)(local_88,local_74 << 4);
        *local_98 = iVar1 + *local_98;
      }
      iVar2 = (*av1_block_error_lp)(local_80,local_90,(long)(local_74 << 4));
      *(int64_t *)(local_98 + 2) = (iVar2 >> 2) + *(long *)(local_98 + 2);
    }
  }
  *local_d0 = local_114;
  *(char *)(local_c8 + 8) = (char)local_114;
  if ((*(long *)(local_c8 + 6) < 0x7fffffffffffffff) &&
     (*(long *)(local_c8 + 6) = (*(long *)(local_c8 + 6) << 6) >> 2, local_114 != 0)) {
    local_c8[2] = 0;
    local_c8[3] = 0;
    *(undefined8 *)(local_c8 + 2) = *(undefined8 *)(local_c8 + 6);
  }
  else {
    *local_c8 = *local_c8 << 0xb;
    *local_c8 = local_104 * 0x200 + *local_c8;
  }
  return;
}

Assistant:

void av1_block_yrd_idtx(MACROBLOCK *x, const uint8_t *const pred_buf,
                        int pred_stride, RD_STATS *this_rdc, int *skippable,
                        BLOCK_SIZE bsize, TX_SIZE tx_size) {
  MACROBLOCKD *xd = &x->e_mbd;
  struct macroblock_plane *const p = &x->plane[AOM_PLANE_Y];
  assert(bsize < BLOCK_SIZES_ALL);
  const int num_4x4_w = mi_size_wide[bsize];
  const int num_4x4_h = mi_size_high[bsize];
  const int step = 1 << (tx_size << 1);
  const int block_step = (1 << tx_size);
  const int max_blocks_wide =
      num_4x4_w + (xd->mb_to_right_edge >= 0 ? 0 : xd->mb_to_right_edge >> 5);
  const int max_blocks_high =
      num_4x4_h + (xd->mb_to_bottom_edge >= 0 ? 0 : xd->mb_to_bottom_edge >> 5);
  int eob_cost = 0;
  const int bw = 4 * num_4x4_w;
  const int bh = 4 * num_4x4_h;
  const int num_blk_skip_w = num_4x4_w;
  // Keep the intermediate value on the stack here. Writing directly to
  // skippable causes speed regression due to load-and-store issues in
  // update_yrd_loop_vars.
  int temp_skippable = 1;
  int tx_wd = 0;
  const SCAN_ORDER *scan_order = NULL;
  switch (tx_size) {
    case TX_64X64:
      assert(0);  // Not implemented
      break;
    case TX_32X32:
      assert(0);  // Not used
      break;
    case TX_16X16:
      scan_order = &av1_fast_idtx_scan_order_16x16;
      tx_wd = 16;
      break;
    case TX_8X8:
      scan_order = &av1_fast_idtx_scan_order_8x8;
      tx_wd = 8;
      break;
    default:
      assert(tx_size == TX_4X4);
      scan_order = &av1_fast_idtx_scan_order_4x4;
      tx_wd = 4;
      break;
  }
  assert(scan_order != NULL);

  this_rdc->dist = 0;
  this_rdc->rate = 0;
  aom_subtract_block(bh, bw, p->src_diff, bw, p->src.buf, p->src.stride,
                     pred_buf, pred_stride);
  // Keep track of the row and column of the blocks we use so that we know
  // if we are in the unrestricted motion border.
  DECLARE_BLOCK_YRD_BUFFERS()
  DECLARE_BLOCK_YRD_VARS()
  for (int r = 0; r < max_blocks_high; r += block_step) {
    for (int c = 0, s = 0; c < max_blocks_wide; c += block_step, s += step) {
      DECLARE_LOOP_VARS_BLOCK_YRD()
      scale_square_buf_vals(low_coeff, tx_wd, src_diff, diff_stride);
      av1_quantize_lp(low_coeff, tx_wd * tx_wd, p->round_fp_QTX,
                      p->quant_fp_QTX, low_qcoeff, low_dqcoeff, p->dequant_QTX,
                      eob, scan_order->scan, scan_order->iscan);
      assert(*eob <= 1024);
      update_yrd_loop_vars(x, &temp_skippable, step, *eob, low_coeff,
                           low_qcoeff, low_dqcoeff, this_rdc, &eob_cost,
                           r * num_blk_skip_w + c);
    }
  }
  this_rdc->skip_txfm = *skippable = temp_skippable;
  if (this_rdc->sse < INT64_MAX) {
    this_rdc->sse = (this_rdc->sse << 6) >> 2;
    if (temp_skippable) {
      this_rdc->dist = 0;
      this_rdc->dist = this_rdc->sse;
      return;
    }
  }
  // If skippable is set, rate gets clobbered later.
  this_rdc->rate <<= (2 + AV1_PROB_COST_SHIFT);
  this_rdc->rate += (eob_cost << AV1_PROB_COST_SHIFT);
}